

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::invertOrientation(SurfaceMesh *this,Face f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  pointer pcVar3;
  runtime_error *this_00;
  size_t sVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  Halfedge he;
  Halfedge he_00;
  
  sVar4 = f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  if (this->useImplicitTwinFlag != true) {
    uVar1 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar4];
    uVar8 = uVar1;
    do {
      he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = uVar8;
      removeFromVertexLists(this,he);
      uVar8 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8];
    } while (uVar8 != uVar1);
    uVar1 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar4];
    uVar8 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar1];
    uVar5 = 0xffffffffffffffff;
    uVar2 = uVar1;
    do {
      uVar6 = uVar2;
      uVar2 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar7 = uVar8;
      if (uVar2 != uVar1) {
        uVar7 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heVertexArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2];
      }
      (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = uVar7;
      (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start[uVar7] = uVar6;
      pcVar3 = (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3[uVar6] = pcVar3[uVar6] == '\0';
      if (uVar5 != 0xffffffffffffffff) {
        (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = uVar5;
      }
      uVar5 = uVar6;
    } while (uVar2 != uVar1);
    (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] = uVar6;
    uVar1 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar4];
    uVar8 = uVar1;
    do {
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .ind = uVar8;
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .mesh = he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh;
      addToVertexLists(this,he_00);
      uVar8 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8];
    } while (uVar8 != uVar1);
    this->modificationTick = this->modificationTick + 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"Cannot invert orientation on oriented surface. Try a general SurfaceMesh.");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SurfaceMesh::invertOrientation(Face f) {
  if (usesImplicitTwin())
    throw std::runtime_error("Cannot invert orientation on oriented surface. Try a general SurfaceMesh.");

  for (Halfedge he : f.adjacentHalfedges()) removeFromVertexLists(he);

  Halfedge firstHe = f.halfedge();
  Halfedge currHe = firstHe;
  Vertex firstVert = currHe.vertex();
  Halfedge prevHe = Halfedge();
  do {
    // gather values
    Halfedge nextHe = currHe.next();
    Vertex nextVert = (nextHe == firstHe) ? firstVert : nextHe.vertex();

    // update
    heVertexArr[currHe.getIndex()] = nextVert.getIndex();
    vHalfedgeArr[nextVert.getIndex()] = currHe.getIndex();
    heOrientArr[currHe.getIndex()] = !heOrientArr[currHe.getIndex()];
    if (prevHe != Halfedge()) {
      heNextArr[currHe.getIndex()] = prevHe.getIndex();
    }

    // continue looping
    prevHe = currHe;
    currHe = nextHe;
  } while (currHe != firstHe);
  heNextArr[firstHe.getIndex()] = prevHe.getIndex();

  for (Halfedge he : f.adjacentHalfedges()) addToVertexLists(he);
  modificationTick++;
}